

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O2

void __thiscall CThumbInstruction::Encode(CThumbInstruction *this)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  CThumbInstruction *pCVar5;
  
  if ((this->Vars).UseNewEncoding == false) {
    uVar2 = (this->Opcode).encoding;
  }
  else {
    uVar2 = (ushort)(this->Vars).NewEncoding;
  }
  switch((this->Opcode).field_0x12 & 0x1f) {
  case 0:
    uVar1 = (this->Vars).Immediate;
    uVar4 = uVar2;
    if (uVar1 == 0) {
      uVar4 = 0;
    }
    if (((this->Opcode).flags & 0x20000) == 0) {
      uVar4 = uVar2;
    }
    uVar2 = (ushort)((this->Vars).rs.num << 3) | (ushort)((uVar1 & 0x1f) << 6) |
            (ushort)(this->Vars).rd.num;
    goto LAB_00156c63;
  case 1:
    uVar1 = (this->Opcode).flags;
    if ((uVar1 & 2) == 0) {
      if ((uVar1 & 4) != 0) {
        iVar3 = (this->Vars).rn.num;
        goto LAB_00156c91;
      }
    }
    else {
      iVar3 = (this->Vars).Immediate;
LAB_00156c91:
      uVar2 = uVar2 | (ushort)(iVar3 << 6);
    }
    uVar2 = (ushort)((this->Vars).rs.num << 3) | uVar2 | (ushort)(this->Vars).rd.num;
    break;
  case 2:
  case 5:
  case 0xb:
    uVar4 = (ushort)((this->Vars).rd.num << 8) | (ushort)(this->Vars).Immediate;
    goto LAB_00156c0d;
  case 3:
    uVar4 = (ushort)((this->Vars).rs.num << 3);
    goto LAB_00156c0a;
  case 4:
    uVar1 = (this->Opcode).flags;
    if ((uVar1 & 8) != 0) {
      iVar3 = (this->Vars).rd.num;
      uVar4 = uVar2 | 0x80;
      if (iVar3 < 8) {
        uVar4 = uVar2;
      }
      uVar2 = (ushort)iVar3 & 7 | uVar4;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar1 = (this->Vars).rs.num;
      uVar4 = uVar2 | 0x40;
      if ((int)uVar1 < 8) {
        uVar4 = uVar2;
      }
      uVar2 = (ushort)((uVar1 & 7) << 3) | uVar4;
    }
    break;
  case 6:
  case 7:
    uVar4 = (ushort)((this->Vars).rs.num << 3) | (ushort)((this->Vars).ro.num << 6);
LAB_00156c0a:
    uVar4 = uVar4 | (ushort)(this->Vars).rd.num;
LAB_00156c0d:
    uVar2 = uVar2 | uVar4;
    break;
  case 8:
  case 9:
    uVar4 = (ushort)((this->Vars).rs.num << 3) |
            (ushort)((this->Vars).Immediate << 6) & (ushort)(((this->Opcode).flags << 0x1e) >> 0x1f)
            | (ushort)(this->Vars).rd.num;
    goto LAB_00156c63;
  case 10:
    uVar2 = uVar2 | (ushort)((this->Vars).rd.num << 8);
    if (((this->Opcode).flags & 2) == 0) break;
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x11:
    uVar2 = uVar2 | (ushort)(this->Vars).Immediate;
    break;
  case 0xd:
    uVar1 = (this->Vars).rlist;
    uVar4 = uVar2 | 0x100;
    if ((uVar1 & 0xc000) == 0) {
      uVar4 = uVar2;
    }
    uVar2 = (ushort)uVar1 & 0xff;
    goto LAB_00156c63;
  case 0xe:
    uVar4 = (ushort)(byte)(this->Vars).rlist | (ushort)((this->Vars).rd.num << 8);
LAB_00156c63:
    uVar2 = uVar2 | uVar4;
    break;
  case 0x12:
    uVar1 = (this->Opcode).flags;
    if ((uVar1 >> 0xc & 1) == 0) {
      uVar2 = (ushort)((int)(uVar1 << 0x1e) >> 0x1f) & (ushort)(this->Vars).Immediate & 0x7ff |
              uVar2;
    }
    else {
      pCVar5 = this;
      WriteInstruction(this,(ushort)((uint)(this->Vars).Immediate >> 0xb) & 0x7ff | uVar2);
      uVar2 = (ushort)(this->Vars).Immediate;
      if (((this->Opcode).flags & 0x400) == 0) {
        uVar2 = uVar2 | 0xf800;
        this = pCVar5;
      }
      else {
        uVar2 = uVar2 & 0x7ff | 0xe800;
        this = pCVar5;
      }
    }
  }
  WriteInstruction(this,uVar2);
  return;
}

Assistant:

void CThumbInstruction::Encode() const
{
	unsigned int encoding = Vars.UseNewEncoding ? Vars.NewEncoding : Opcode.encoding;

	if (Opcode.type == THUMB_TYPE19)	// THUMB.19: long branch with link
	{
		if (Opcode.flags & THUMB_LONG)
		{
			encoding |= ((Vars.Immediate >> 11) & 0x7FF);
			WriteInstruction(encoding);

			if (Opcode.flags & THUMB_EXCHANGE)
			{
				WriteInstruction(0xE800 | (Vars.Immediate & 0x7FF));
			} else {
				WriteInstruction(0xF800 | (Vars.Immediate & 0x7FF));
			}
		} else {
			if (Opcode.flags & THUMB_IMMEDIATE)
				encoding |= Vars.Immediate & 0x7FF;
			WriteInstruction(encoding);
		}
	} else {
		switch (Opcode.type)
		{
		case THUMB_TYPE1:	// THUMB.1: move shifted register
			if ((Opcode.flags & THUMB_RIGHTSHIFT_IMMEDIATE) && (Vars.Immediate == 0))
			{
				encoding = 0x0000;
			}
			encoding |= ((Vars.Immediate & 0x1F) << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE2:	// THUMB.2: add/subtract
			if (Opcode.flags & THUMB_IMMEDIATE)
			{
				encoding |= (Vars.Immediate << 6);
			} else if (Opcode.flags & THUMB_REGISTER)
			{
				encoding |= (Vars.rn.num << 6);
			}
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE3:	// THUMB.3: move/compare/add/subtract immediate
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE4:	// THUMB.4: ALU operations
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE5:	// THUMB.5: Hi register operations/branch exchange
			if (Opcode.flags & THUMB_D)
			{
				if (Vars.rd.num > 0x7) encoding |= (1 << 7);
				encoding |= (Vars.rd.num & 0x7);
			}
			if (Opcode.flags & THUMB_S)
			{
				if (Vars.rs.num > 0x7) encoding |= (1 << 6);
				encoding |= ((Vars.rs.num & 0x7) << 3);
			}
			break;
		case THUMB_TYPE6:	// THUMB.6: load PC-relative
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE7:	// THUMB.7: load/store with register offset
		case THUMB_TYPE8:	// THUMB.8: load/store sign-extended byte/halfword
			encoding |= (Vars.ro.num << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE9:	// THUMB.9: load/store with immediate offset
		case THUMB_TYPE10:	// THUMB.10: load/store halfword
			if (Opcode.flags & THUMB_IMMEDIATE) encoding |= (Vars.Immediate << 6);
			encoding |= (Vars.rs.num << 3);
			encoding |= (Vars.rd.num << 0);
			break;
		case THUMB_TYPE11:	// THUMB.11: load/store SP-relative
			encoding |= (Vars.rd.num << 8);
			if (Opcode.flags & THUMB_IMMEDIATE) encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE12:	// THUMB.12: get relative address
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE13:	// THUMB.13: add/subtract offset to/from stack pointer
			encoding |= (Vars.Immediate << 0);
			break;
		case THUMB_TYPE14:	// THUMB.14: push/pop registers
			if (Vars.rlist & 0xC000) encoding |= (1 << 8); // r14 oder r15
			encoding |= (Vars.rlist & 0xFF);
			break;
		case THUMB_TYPE15:	// THUMB.15: multiple load/store
			encoding |= (Vars.rd.num << 8);
			encoding |= (Vars.rlist & 0xFF);
			break;
		case THUMB_TYPE16:	// THUMB.16: conditional branch
		case THUMB_TYPE17:	// THUMB.17: software interrupt and breakpoint
		case THUMB_TYPE18:	// THUMB.18: unconditional branch
			encoding |= (Vars.Immediate << 0);
			break;
		}
		WriteInstruction(encoding);
	}
}